

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_variant.cc
# Opt level: O0

void __thiscall variant_copy_type_Test::~variant_copy_type_Test(variant_copy_type_Test *this)

{
  variant_copy_type_Test *this_local;
  
  ~variant_copy_type_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(variant, copy_type) {
    static constexpr int expected = 42;

    Variant<A, B> v{};

    ASSERT_TRUE(v.holds<empty>());

    const auto& b = v.set(B{expected});

    EXPECT_EQ(b.value, expected);
    ASSERT_TRUE(v.holds<B>());
    EXPECT_EQ(v.get<B>().value, expected);
}